

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.pb.cc
# Opt level: O0

void __thiscall bloaty::CustomDataSource::~CustomDataSource(CustomDataSource *this)

{
  RepeatedPtrField<bloaty::Regex> *in_RDI;
  CustomDataSource *unaff_retaddr;
  
  (in_RDI->super_RepeatedPtrFieldBase).arena_ = (Arena *)&PTR__CustomDataSource_00888a40;
  SharedDtor(unaff_retaddr);
  google::protobuf::RepeatedPtrField<bloaty::Regex>::~RepeatedPtrField(in_RDI);
  google::protobuf::internal::InternalMetadataWithArena::~InternalMetadataWithArena
            ((InternalMetadataWithArena *)0x1a6fd0);
  google::protobuf::Message::~Message((Message *)0x1a6fda);
  return;
}

Assistant:

CustomDataSource::~CustomDataSource() {
  // @@protoc_insertion_point(destructor:bloaty.CustomDataSource)
  SharedDtor();
}